

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O2

void compareB44(int width,int height,Array2D<Imf_3_4::Rgba> *p1,Array2D<Imf_3_4::Rgba> *p2,
               RgbaChannels channels)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  half *phVar7;
  ulong uVar8;
  half *phVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  Rgba *pRVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  half B [4] [4];
  half A [4] [4];
  Rgba *local_b8;
  long local_b0;
  half local_78 [16];
  half local_58 [20];
  
  uVar17 = (ulong)(uint)height;
  lVar4 = (long)width;
  lVar5 = (long)height;
  if ((channels & WRITE_R) == 0) {
    local_b0 = p2->_sizeY;
    local_b8 = p2->_data;
    uVar6 = 0;
    uVar8 = 0;
    if (0 < width) {
      uVar8 = (ulong)(uint)width;
    }
    uVar11 = 0;
    pRVar13 = local_b8;
    if (0 < height) {
      uVar11 = (ulong)(uint)height;
    }
    for (; uVar6 != uVar11; uVar6 = uVar6 + 1) {
      uVar16 = 0;
      while (uVar8 != uVar16) {
        fVar1 = *(float *)(_imath_half_to_float_table + (ulong)pRVar13[uVar16].r._h * 4);
        uVar16 = uVar16 + 1;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          __assert_fail("p2[y][x].r == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0xed,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
      pRVar13 = pRVar13 + local_b0;
    }
  }
  else {
    lVar2 = p1->_sizeY;
    pRVar13 = p1->_data;
    local_b0 = p2->_sizeY;
    local_b8 = p2->_data;
    for (lVar19 = 0; lVar19 < lVar5; lVar19 = lVar19 + 4) {
      for (lVar18 = 0; lVar18 < lVar4; lVar18 = lVar18 + 4) {
        phVar7 = local_78;
        phVar9 = local_58;
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          uVar12 = (uint)lVar10 | (uint)lVar19;
          if ((int)(height - 1U) < (int)uVar12) {
            uVar12 = height - 1U;
          }
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            iVar15 = (int)lVar14 + (int)lVar18;
            if (width + -1 < iVar15) {
              iVar15 = width + -1;
            }
            phVar9[lVar14]._h = pRVar13[lVar2 * (int)uVar12 + (long)iVar15].r._h;
            phVar7[lVar14]._h = local_b8[(int)uVar12 * local_b0 + (long)iVar15].r._h;
          }
          phVar9 = phVar9 + 4;
          phVar7 = phVar7 + 4;
        }
        bVar3 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
        if (!bVar3) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0xe5,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  if ((channels & WRITE_G) == 0) {
    uVar6 = 0;
    uVar8 = 0;
    if (0 < width) {
      uVar8 = (ulong)(uint)width;
    }
    uVar11 = 0;
    if (0 < height) {
      uVar11 = uVar17;
    }
    phVar7 = &local_b8->g;
    for (; uVar6 != uVar11; uVar6 = uVar6 + 1) {
      uVar16 = 0;
      while (uVar8 != uVar16) {
        fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar7[uVar16 * 4]._h * 4);
        uVar16 = uVar16 + 1;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          __assert_fail("p2[y][x].g == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x10c,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
      phVar7 = phVar7 + local_b0 * 4;
    }
  }
  else {
    lVar2 = p1->_sizeY;
    pRVar13 = p1->_data;
    for (lVar19 = 0; lVar19 < lVar5; lVar19 = lVar19 + 4) {
      for (lVar18 = 0; lVar18 < lVar4; lVar18 = lVar18 + 4) {
        phVar7 = local_78;
        phVar9 = local_58;
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          uVar12 = (uint)lVar10 | (uint)lVar19;
          if ((int)(height - 1U) < (int)uVar12) {
            uVar12 = height - 1U;
          }
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            iVar15 = (int)lVar14 + (int)lVar18;
            if (width + -1 < iVar15) {
              iVar15 = width + -1;
            }
            phVar9[lVar14]._h = pRVar13[lVar2 * (int)uVar12 + (long)iVar15].g._h;
            phVar7[lVar14]._h = local_b8[(int)uVar12 * local_b0 + (long)iVar15].g._h;
          }
          phVar9 = phVar9 + 4;
          phVar7 = phVar7 + 4;
        }
        bVar3 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
        if (!bVar3) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x104,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  if ((channels & WRITE_B) == 0) {
    uVar6 = 0;
    uVar8 = 0;
    if (0 < width) {
      uVar8 = (ulong)(uint)width;
    }
    uVar11 = 0;
    if (0 < height) {
      uVar11 = uVar17;
    }
    phVar7 = &local_b8->b;
    for (; uVar6 != uVar11; uVar6 = uVar6 + 1) {
      uVar16 = 0;
      while (uVar8 != uVar16) {
        fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar7[uVar16 * 4]._h * 4);
        uVar16 = uVar16 + 1;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          __assert_fail("p2[y][x].b == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,299,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
      phVar7 = phVar7 + local_b0 * 4;
    }
  }
  else {
    lVar2 = p1->_sizeY;
    pRVar13 = p1->_data;
    for (lVar19 = 0; lVar19 < lVar5; lVar19 = lVar19 + 4) {
      for (lVar18 = 0; lVar18 < lVar4; lVar18 = lVar18 + 4) {
        phVar7 = local_78;
        phVar9 = local_58;
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          uVar12 = (uint)lVar10 | (uint)lVar19;
          if ((int)(height - 1U) < (int)uVar12) {
            uVar12 = height - 1U;
          }
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            iVar15 = (int)lVar14 + (int)lVar18;
            if (width + -1 < iVar15) {
              iVar15 = width + -1;
            }
            phVar9[lVar14]._h = pRVar13[lVar2 * (int)uVar12 + (long)iVar15].b._h;
            phVar7[lVar14]._h = local_b8[(int)uVar12 * local_b0 + (long)iVar15].b._h;
          }
          phVar9 = phVar9 + 4;
          phVar7 = phVar7 + 4;
        }
        bVar3 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
        if (!bVar3) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x123,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  if ((channels & WRITE_A) == 0) {
    uVar8 = 0;
    uVar6 = (ulong)(uint)width;
    if (width < 1) {
      uVar6 = uVar8;
    }
    if (height < 1) {
      uVar17 = uVar8;
    }
    local_b8 = (Rgba *)&local_b8->a;
    for (; uVar8 != uVar17; uVar8 = uVar8 + 1) {
      uVar11 = 0;
      while (uVar6 != uVar11) {
        fVar1 = *(float *)(_imath_half_to_float_table +
                          (ulong)((half *)((long)local_b8 + uVar11 * 4 * 2))->_h * 4);
        uVar11 = uVar11 + 1;
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          __assert_fail("p2[y][x].a == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x14a,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
      local_b8 = (Rgba *)((long)local_b8 + local_b0 * 4 * 2);
    }
  }
  else {
    lVar2 = p1->_sizeY;
    pRVar13 = p1->_data;
    for (lVar19 = 0; lVar19 < lVar5; lVar19 = lVar19 + 4) {
      for (lVar18 = 0; lVar18 < lVar4; lVar18 = lVar18 + 4) {
        phVar7 = local_78;
        phVar9 = local_58;
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          uVar12 = (uint)lVar10 | (uint)lVar19;
          if ((int)(height - 1U) < (int)uVar12) {
            uVar12 = height - 1U;
          }
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            iVar15 = (int)lVar14 + (int)lVar18;
            if (width + -1 < iVar15) {
              iVar15 = width + -1;
            }
            phVar9[lVar14]._h = pRVar13[lVar2 * (int)uVar12 + (long)iVar15].a._h;
            phVar7[lVar14]._h = local_b8[(int)uVar12 * local_b0 + (long)iVar15].a._h;
          }
          phVar9 = phVar9 + 4;
          phVar7 = phVar7 + 4;
        }
        bVar3 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
        if (!bVar3) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x142,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

void
compareB44 (
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    const Array2D<Rgba>& p2,
    RgbaChannels         channels)
{
    if (channels & WRITE_R)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].r;
                        B[y1][x1] = p2[y2][x2].r;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].r == 0);
    }

    if (channels & WRITE_G)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].g;
                        B[y1][x1] = p2[y2][x2].g;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].g == 0);
    }

    if (channels & WRITE_B)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].b;
                        B[y1][x1] = p2[y2][x2].b;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].b == 0);
    }

    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].a;
                        B[y1][x1] = p2[y2][x2].a;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].a == 1);
    }
}